

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O0

_Bool adt_u32Set_remove(adt_u32Set_t *self,uint32_t val)

{
  _Bool _Var1;
  adt_u32List_elem_t *local_20;
  adt_u32List_elem_t *iter;
  _Bool retval;
  uint32_t val_local;
  adt_u32Set_t *self_local;
  
  _Var1 = false;
  if (self != (adt_u32Set_t *)0x0) {
    local_20 = adt_u32List_iter_last(&self->list);
    if (local_20 != (adt_u32List_elem_t *)0x0) {
      if (val == local_20->item) {
        _Var1 = true;
      }
      else if (val < local_20->item) {
        for (local_20 = adt_u32List_iter_first(&self->list); local_20 != (adt_u32List_elem_t *)0x0;
            local_20 = adt_u32List_iter_next(local_20)) {
          if (val == local_20->item) {
            _Var1 = true;
            break;
          }
          if (val < local_20->item) break;
        }
      }
    }
    if (_Var1 == true) {
      adt_u32List_erase(&self->list,local_20);
    }
  }
  return _Var1;
}

Assistant:

bool adt_u32Set_remove(adt_u32Set_t *self, uint32_t val)
{
   bool retval = false;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = adt_u32List_iter_last(&self->list);
      if (iter != 0)
      {
         if ( val == iter->item )
         {
            retval = true;
         }
         else if (val < iter->item)
         {
            iter = adt_u32List_iter_first(&self->list);
            while (iter != 0)
            {
               if ( val == iter->item )
               {
                  retval = true;
                  break;
               }
               else if (val < iter->item)
               {
                  break;
               }
               iter = adt_u32List_iter_next(iter);
            }
         }
      }
      if (retval == true)
      {
         adt_u32List_erase(&self->list, iter);
      }
   }
   return retval;
}